

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int fast_s_mp_mul_digs(mp_int *a,mp_int *b,mp_int *c,int digs)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  mp_digit *pmVar9;
  ulong *puVar10;
  mp_digit *pmVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  mp_digit W [512];
  ulong local_1038 [513];
  
  if ((c->alloc < digs) && (iVar5 = mp_grow(c,digs), iVar5 != 0)) {
    return iVar5;
  }
  iVar5 = a->used;
  iVar1 = b->used;
  uVar6 = iVar1 + iVar5;
  if ((int)uVar6 < digs) {
    digs = uVar6;
  }
  uVar16 = (ulong)(uint)digs;
  if (0 < digs) {
    pmVar9 = a->dp;
    pmVar11 = b->dp;
    uVar14 = 0;
    auVar4 = ZEXT816(0);
    do {
      iVar7 = iVar1 + -1;
      if ((long)uVar14 < (long)iVar1) {
        iVar7 = (int)uVar14;
      }
      iVar12 = (iVar7 - (int)uVar14) + iVar5;
      iVar8 = iVar7 + 1;
      if (iVar12 <= iVar7) {
        iVar8 = iVar12;
      }
      if (0 < iVar8) {
        puVar10 = pmVar11 + iVar7;
        lVar13 = 0;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *puVar10;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pmVar9[lVar13 - iVar7];
          puVar10 = puVar10 + -1;
          auVar4 = auVar2 * auVar3 + auVar4;
          lVar13 = lVar13 + 1;
        } while (iVar8 != (int)lVar13);
      }
      uVar15 = auVar4._0_8_;
      auVar4 = auVar4 >> 0x3c;
      local_1038[uVar14] = uVar15 & 0xfffffffffffffff;
      uVar14 = uVar14 + 1;
      pmVar9 = pmVar9 + 1;
    } while (uVar14 != uVar16);
  }
  iVar5 = c->used;
  c->used = digs;
  pmVar9 = c->dp;
  if (digs < 0) {
    uVar6 = 0;
    pmVar11 = pmVar9;
  }
  else {
    uVar6 = digs + 1;
    memcpy(pmVar9,local_1038,uVar16 * 8 + 8);
    pmVar11 = pmVar9 + uVar16 + 1;
  }
  if ((int)uVar6 < iVar5) {
    memset(pmVar11,0,(ulong)(iVar5 + ~uVar6) * 8 + 8);
  }
  if (digs < 1) {
    if (digs != 0) {
      return 0;
    }
  }
  else {
    do {
      iVar5 = (int)uVar16;
      if (pmVar9[uVar16 - 1] != 0) {
        return 0;
      }
      uVar6 = iVar5 - 1;
      c->used = uVar6;
      uVar16 = (ulong)uVar6;
    } while (1 < iVar5);
  }
  c->sign = 0;
  return 0;
}

Assistant:

int fast_s_mp_mul_digs (mp_int * a, mp_int * b, mp_int * c, int digs)
{
  int     olduse, res, pa, ix, iz;
  mp_digit W[MP_WARRAY];
  register mp_word  _W;

  /* grow the destination as required */
  if (c->alloc < digs) {
    if ((res = mp_grow (c, digs)) != MP_OKAY) {
      return res;
    }
  }

  /* number of output digits to produce */
  pa = MIN(digs, a->used + b->used);

  /* clear the carry */
  _W = 0;
  for (ix = 0; ix < pa; ix++) { 
      int      tx, ty;
      int      iy;
      mp_digit *tmpx, *tmpy;

      /* get offsets into the two bignums */
      ty = MIN(b->used-1, ix);
      tx = ix - ty;

      /* setup temp aliases */
      tmpx = a->dp + tx;
      tmpy = b->dp + ty;

      /* this is the number of times the loop will iterrate, essentially 
         while (tx++ < a->used && ty-- >= 0) { ... }
       */
      iy = MIN(a->used-tx, ty+1);

      /* execute loop */
      for (iz = 0; iz < iy; ++iz) {
         _W += ((mp_word)*tmpx++)*((mp_word)*tmpy--);

      }

      /* store term */
      W[ix] = ((mp_digit)_W) & MP_MASK;

      /* make next carry */
      _W = _W >> ((mp_word)DIGIT_BIT);
 }

  /* setup dest */
  olduse  = c->used;
  c->used = pa;

  {
    register mp_digit *tmpc;
    tmpc = c->dp;
    for (ix = 0; ix < pa+1; ix++) {
      /* now extract the previous digit [below the carry] */
      *tmpc++ = W[ix];
    }

    /* clear unused digits [that existed in the old copy of c] */
    for (; ix < olduse; ix++) {
      *tmpc++ = 0;
    }
  }
  mp_clamp (c);
  return MP_OKAY;
}